

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96Sign(octet *sig,bign_params *params,octet *oid_der,size_t oid_len,octet *hash,
                octet *privkey,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  bign_params *params_00;
  octet *b;
  octet *mod;
  octet *src;
  ec_o *in_RCX;
  word *in_RDX;
  word *in_RSI;
  void *in_RDI;
  word *in_R8;
  word *in_R9;
  octet *stack;
  word *s1;
  word *s0;
  word *R;
  word *k;
  word *d;
  ec_o *ec;
  void *state;
  size_t n;
  err_t code;
  size_t in_stack_ffffffffffffff78;
  octet *dest;
  size_t in_stack_ffffffffffffff88;
  octet *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  octet *rng_00;
  octet *a;
  bign_params *a_00;
  void *in_stack_ffffffffffffffb8;
  word *a_01;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else if (*in_RSI == 0x60) {
    if ((in_RCX != (ec_o *)0xffffffffffffffff) &&
       (sVar4 = oidFromDER(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff88), sVar4 != 0xffffffffffffffff)) {
      if (s1 == (word *)0x0) {
        return 0x130;
      }
      bign96Start_keep((bign96_deep_i)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
      ;
      params_00 = (bign_params *)blobCreate(in_stack_ffffffffffffff78);
      if (params_00 == (bign_params *)0x0) {
        return 0x6e;
      }
      eVar2 = bign96Start(in_stack_ffffffffffffffb8,params_00);
      if (eVar2 != 0) {
        blobClose((blob_t)0x14a355);
        return eVar2;
      }
      a_01 = *(word **)(*(long *)(params_00->p + 0x10) + 0x30);
      a_00 = params_00;
      bVar1 = memIsValid(in_R8,0x18);
      if ((((bVar1 != 0) && (bVar1 = memIsValid(in_R9,0x18), bVar1 != 0)) &&
          (bVar1 = memIsValid(in_RDI,0x22), bVar1 != 0)) &&
         (bVar1 = memIsDisjoint2(in_R8,0x18,in_RDI,0x22), bVar1 != 0)) {
        dest = params_00->p + (params_00->l - 8);
        rng_00 = dest + (long)a_01 * 8;
        b = rng_00 + (long)a_01 * 8;
        mod = b + (long)a_01 * 8 + 0x10;
        src = b + (long)a_01 * 8 + 0x20;
        a = dest;
        u64From((u64 *)dest,src,0x14a473);
        bVar1 = wwIsZero((word *)a,(size_t)a_01);
        if ((bVar1 != 0) ||
           (iVar3 = wwCmp((word *)a,*(word **)(params_00->p + 0x30),(size_t)a_01), -1 < iVar3)) {
          blobClose((blob_t)0x14a4ae);
          return 0x1f8;
        }
        bVar1 = zzRandNZMod(&a_00->l,&params_00->l,(size_t)a,(gen_i)rng_00,b);
        if (bVar1 == 0) {
          blobClose((blob_t)0x14a4f5);
          return 0x130;
        }
        bVar1 = ecMulA(in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_R9,
                       (void *)CONCAT44(eVar2,in_stack_ffffffffffffffc0));
        if (bVar1 == 0) {
          blobClose((blob_t)0x14a53a);
          return 0x1f6;
        }
        (**(code **)(*(long *)(params_00->p + 0x10) + 0x48))
                  (b,b,*(undefined8 *)(params_00->p + 0x10),src);
        beltHashStart(dest);
        beltHashStepH(b,(size_t)mod,dest);
        beltHashStepH(b,(size_t)mod,dest);
        beltHashStepH(b,(size_t)mod,dest);
        beltHashStepG2(b,(size_t)mod,dest);
        *(undefined1 *)((long)in_RDI + 0xb) = 0;
        *(undefined1 *)((long)in_RDI + 10) = 0;
        *(undefined1 *)((long)in_RDI + 0xc) = 0x80;
        u64From((u64 *)dest,src,0x14a5f4);
        zzMul((word *)CONCAT44(eVar2,in_stack_ffffffffffffffc0),a_01,(size_t)a_00,&params_00->l,
              (size_t)a,rng_00);
        zzMod(in_RDX,(word *)in_RCX,(size_t)in_R8,in_R9,CONCAT44(eVar2,in_stack_ffffffffffffffc0),
              a_01);
        zzSubMod((word *)a,(word *)rng_00,(word *)b,(word *)mod,(size_t)dest);
        u64From((u64 *)dest,src,0x14a676);
        zzSubMod((word *)a,(word *)rng_00,(word *)b,(word *)mod,(size_t)dest);
        u64To(dest,(size_t)src,(u64 *)0x14a6b0);
        blobClose((blob_t)0x14a6ba);
        return 0;
      }
      blobClose((blob_t)0x14a3e5);
      return 0x6d;
    }
    local_4 = 0x12d;
  }
  else {
    local_4 = 0x1f6;
  }
  return local_4;
}

Assistant:

err_t bign96Sign(octet sig[34], const bign_params* params,
	const octet oid_der[], size_t oid_len, const octet hash[24],
	const octet privkey[24], gen_i rng, void* rng_state)
{
	err_t code;
	size_t n;
	// состояние (буферы могут пересекаться)
	void* state;			
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* k;				/* [n] одноразовый личный ключ */
	word* R;				/* [2n] точка R */
	word* s0;				/* [W_OF_O(13)] первая часть подписи */
	word* s1;				/* [n] вторая часть подписи */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len) == SIZE_MAX)
		return ERR_BAD_OID;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96Sign_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(hash, 24) ||
		!memIsValid(privkey, 24) ||
		!memIsValid(sig, 34) ||
		!memIsDisjoint2(hash, 24, sig, 34))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = s1 = objEnd(ec, word);
	k = d + n;
	R = k + n;
	s0 = R + n + W_OF_O(13);
	stack = (octet*)(s0 + W_OF_O(13));
	// загрузить d
	wwFrom(d, privkey, 24);
	if (wwIsZero(d, n) || wwCmp(d, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// сгенерировать k с помощью rng
	if (!zzRandNZMod(k, ec->order, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// R <- k G
	if (!ecMulA(R, ec->base, ec, k, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 <- belt-hash(oid || R || H) mod 2^80 + 2^l
	beltHashStart(stack);
	beltHashStepH(oid_der, oid_len, stack);
	beltHashStepH(R, 24, stack);
	beltHashStepH(hash, 24, stack);
	beltHashStepG2(sig, 10, stack);
	sig[10] = sig[11] = 0, sig[12] = 0x80;
	wwFrom(s0, sig, 13);
	// R <- (s0 + 2^l) d
	zzMul(R, s0, W_OF_O(13), d, n, stack);
	// s1 <- R mod q
	zzMod(s1, R, n + W_OF_O(13), ec->order, n, stack);
	// s1 <- (k - s1 - H) mod q
	zzSubMod(s1, k, s1, ec->order, n);
	wwFrom(k, hash, 24);
	zzSubMod(s1, s1, k, ec->order, n);
	// выгрузить s1
	wwTo(sig + 10, 24, s1);
	// все нормально
	blobClose(state);
	return ERR_OK;
}